

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::BVHNIntersector1<8,_257,_true,_embree::avx::VirtualCurveIntersector1>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  byte bVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [12];
  char cVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong *puVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar34 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar39 [16];
  float fVar45;
  undefined1 auVar40 [32];
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar41 [64];
  undefined1 extraout_var [56];
  undefined1 auVar46 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar47 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  float fVar66;
  vfloat4 a0;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar72;
  undefined1 auVar73 [32];
  float fVar74;
  float fVar78;
  float fVar79;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar77 [32];
  float fVar84;
  float fVar88;
  float fVar89;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar87 [32];
  float fVar94;
  float fVar98;
  float fVar99;
  undefined1 auVar95 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar96 [32];
  float fVar100;
  undefined1 auVar97 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  Precalculations pre;
  NodeRef stack [564];
  float local_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float local_1218 [4];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  ulong local_11d8;
  ulong local_11d0 [564];
  undefined1 auVar54 [32];
  undefined1 auVar58 [32];
  undefined1 auVar65 [32];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar35 = ray->tfar;
    if (0.0 <= fVar35) {
      aVar5 = (ray->dir).field_0.field_1;
      auVar52 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
      auVar32 = vrsqrtss_avx(auVar52,auVar52);
      fVar66 = auVar32._0_4_;
      local_1218[0] = fVar66 * 1.5 - auVar52._0_4_ * 0.5 * fVar66 * fVar66 * fVar66;
      fVar66 = (ray->dir).field_0.m128[0];
      fVar1 = (ray->dir).field_0.m128[1];
      fVar2 = (ray->dir).field_0.m128[2];
      auVar55 = vshufps_avx(ZEXT416((uint)local_1218[0]),ZEXT416((uint)local_1218[0]),0);
      auVar67._0_4_ = aVar5.x * auVar55._0_4_;
      auVar67._4_4_ = aVar5.y * auVar55._4_4_;
      auVar67._8_4_ = aVar5.z * auVar55._8_4_;
      auVar67._12_4_ = aVar5.field_3.w * auVar55._12_4_;
      auVar32 = vshufpd_avx(auVar67,auVar67,1);
      auVar52 = vmovshdup_avx(auVar67);
      auVar85._8_4_ = 0x80000000;
      auVar85._0_8_ = 0x8000000080000000;
      auVar85._12_4_ = 0x80000000;
      auVar68._12_4_ = 0;
      auVar68._0_12_ = ZEXT812(0);
      auVar68 = auVar68 << 0x20;
      auVar75 = vunpckhps_avx(auVar67,auVar68);
      auVar59 = vshufps_avx(auVar75,ZEXT416(auVar52._0_4_ ^ 0x80000000),0x41);
      auVar75._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
      auVar75._8_8_ = auVar32._8_8_ ^ auVar85._8_8_;
      auVar75 = vinsertps_avx(auVar75,auVar67,0x2a);
      auVar52 = vdpps_avx(auVar59,auVar59,0x7f);
      auVar32 = vdpps_avx(auVar75,auVar75,0x7f);
      auVar52 = vcmpps_avx(auVar32,auVar52,1);
      auVar52 = vshufps_avx(auVar52,auVar52,0);
      auVar52 = vblendvps_avx(auVar75,auVar59,auVar52);
      auVar32 = vdpps_avx(auVar52,auVar52,0x7f);
      auVar75 = vrsqrtss_avx(auVar32,auVar32);
      fVar72 = auVar75._0_4_;
      auVar32 = ZEXT416((uint)(fVar72 * 1.5 - auVar32._0_4_ * 0.5 * fVar72 * fVar72 * fVar72));
      auVar32 = vshufps_avx(auVar32,auVar32,0);
      auVar76._0_4_ = auVar52._0_4_ * auVar32._0_4_;
      auVar76._4_4_ = auVar52._4_4_ * auVar32._4_4_;
      auVar76._8_4_ = auVar52._8_4_ * auVar32._8_4_;
      auVar76._12_4_ = auVar52._12_4_ * auVar32._12_4_;
      auVar52 = vshufps_avx(auVar76,auVar76,0xc9);
      auVar32 = vshufps_avx(auVar67,auVar67,0xc9);
      auVar95._0_4_ = auVar32._0_4_ * auVar76._0_4_;
      auVar95._4_4_ = auVar32._4_4_ * auVar76._4_4_;
      auVar95._8_4_ = auVar32._8_4_ * auVar76._8_4_;
      auVar95._12_4_ = auVar32._12_4_ * auVar76._12_4_;
      auVar86._0_4_ = auVar52._0_4_ * auVar67._0_4_;
      auVar86._4_4_ = auVar52._4_4_ * auVar67._4_4_;
      auVar86._8_4_ = auVar52._8_4_ * auVar67._8_4_;
      auVar86._12_4_ = auVar52._12_4_ * auVar67._12_4_;
      auVar52 = vsubps_avx(auVar86,auVar95);
      auVar75 = vshufps_avx(auVar52,auVar52,0xc9);
      auVar52 = vdpps_avx(auVar75,auVar75,0x7f);
      auVar32 = vrsqrtss_avx(auVar52,auVar52);
      fVar72 = auVar32._0_4_;
      auVar52 = ZEXT416((uint)(fVar72 * 1.5 - fVar72 * fVar72 * fVar72 * auVar52._0_4_ * 0.5));
      auVar52 = vshufps_avx(auVar52,auVar52,0);
      auVar32._0_4_ = auVar75._0_4_ * auVar52._0_4_;
      auVar32._4_4_ = auVar75._4_4_ * auVar52._4_4_;
      auVar32._8_4_ = auVar75._8_4_ * auVar52._8_4_;
      auVar32._12_4_ = auVar75._12_4_ * auVar52._12_4_;
      auVar52._0_4_ = auVar55._0_4_ * auVar67._0_4_;
      auVar52._4_4_ = auVar55._4_4_ * auVar67._4_4_;
      auVar52._8_4_ = auVar55._8_4_ * auVar67._8_4_;
      auVar52._12_4_ = auVar55._12_4_ * auVar67._12_4_;
      auVar75 = vunpcklps_avx(auVar76,auVar52);
      auVar52 = vunpckhps_avx(auVar76,auVar52);
      auVar55 = vunpcklps_avx(auVar32,auVar68);
      auVar32 = vunpckhps_avx(auVar32,auVar68);
      local_11e8 = vunpcklps_avx(auVar52,auVar32);
      local_1208 = vunpcklps_avx(auVar75,auVar55);
      local_11f8 = vunpckhps_avx(auVar75,auVar55);
      puVar29 = local_11d0;
      auVar75 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar55._8_4_ = 0x7fffffff;
      auVar55._0_8_ = 0x7fffffff7fffffff;
      auVar55._12_4_ = 0x7fffffff;
      auVar52 = vandps_avx((undefined1  [16])aVar5,auVar55);
      auVar59._8_4_ = 0x219392ef;
      auVar59._0_8_ = 0x219392ef219392ef;
      auVar59._12_4_ = 0x219392ef;
      auVar52 = vcmpps_avx(auVar52,auVar59,1);
      auVar60._8_4_ = 0x3f800000;
      auVar60._0_8_ = 0x3f8000003f800000;
      auVar60._12_4_ = 0x3f800000;
      auVar32 = vdivps_avx(auVar60,(undefined1  [16])aVar5);
      auVar61._8_4_ = 0x5d5e0b6b;
      auVar61._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar61._12_4_ = 0x5d5e0b6b;
      auVar52 = vblendvps_avx(auVar32,auVar61,auVar52);
      auVar56._0_4_ = auVar52._0_4_ * 0.99999964;
      auVar56._4_4_ = auVar52._4_4_ * 0.99999964;
      auVar56._8_4_ = auVar52._8_4_ * 0.99999964;
      auVar56._12_4_ = auVar52._12_4_ * 0.99999964;
      fVar72 = (ray->org).field_0.m128[0];
      auVar108._4_4_ = fVar72;
      auVar108._0_4_ = fVar72;
      auVar108._8_4_ = fVar72;
      auVar108._12_4_ = fVar72;
      auVar108._16_4_ = fVar72;
      auVar108._20_4_ = fVar72;
      auVar108._24_4_ = fVar72;
      auVar108._28_4_ = fVar72;
      fVar3 = (ray->org).field_0.m128[1];
      auVar69._4_4_ = fVar3;
      auVar69._0_4_ = fVar3;
      auVar69._8_4_ = fVar3;
      auVar69._12_4_ = fVar3;
      auVar69._16_4_ = fVar3;
      auVar69._20_4_ = fVar3;
      auVar69._24_4_ = fVar3;
      auVar69._28_4_ = fVar3;
      fVar4 = (ray->org).field_0.m128[2];
      auVar106._4_4_ = fVar4;
      auVar106._0_4_ = fVar4;
      auVar106._8_4_ = fVar4;
      auVar106._12_4_ = fVar4;
      auVar106._16_4_ = fVar4;
      auVar106._20_4_ = fVar4;
      auVar106._24_4_ = fVar4;
      auVar106._28_4_ = fVar4;
      auVar62._0_4_ = auVar52._0_4_ * 1.0000004;
      auVar62._4_4_ = auVar52._4_4_ * 1.0000004;
      auVar62._8_4_ = auVar52._8_4_ * 1.0000004;
      auVar62._12_4_ = auVar52._12_4_ * 1.0000004;
      auVar55 = vshufps_avx(auVar56,auVar56,0);
      auVar52 = vmovshdup_avx(auVar56);
      auVar59 = vshufps_avx(auVar56,auVar56,0x55);
      auVar32 = vshufpd_avx(auVar56,auVar56,1);
      auVar68 = vshufps_avx(auVar56,auVar56,0xaa);
      auVar60 = vshufps_avx(auVar62,auVar62,0);
      uVar31 = (ulong)(auVar56._0_4_ < 0.0) * 0x20;
      auVar56 = vshufps_avx(auVar62,auVar62,0x55);
      auVar61 = vshufps_avx(auVar62,auVar62,0xaa);
      uVar28 = (ulong)(auVar52._0_4_ < 0.0) << 5 | 0x40;
      uVar30 = (ulong)(auVar32._0_4_ < 0.0) << 5 | 0x80;
      auVar52 = vshufps_avx(auVar75,auVar75,0);
      auVar41 = ZEXT1664(auVar52);
      auVar64._16_16_ = auVar52;
      auVar64._0_16_ = auVar52;
      auVar52 = vshufps_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35),0);
      auVar104._16_16_ = auVar52;
      auVar104._0_16_ = auVar52;
LAB_00e50a10:
      if (puVar29 != &local_11d8) {
        uVar25 = puVar29[-1];
        puVar29 = puVar29 + -1;
LAB_00e50a21:
        if ((uVar25 & 0xf) == 0) {
          auVar8 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar31),auVar108);
          auVar12._4_4_ = auVar55._4_4_ * auVar8._4_4_;
          auVar12._0_4_ = auVar55._0_4_ * auVar8._0_4_;
          auVar12._8_4_ = auVar55._8_4_ * auVar8._8_4_;
          auVar12._12_4_ = auVar55._12_4_ * auVar8._12_4_;
          auVar12._16_4_ = auVar55._0_4_ * auVar8._16_4_;
          auVar12._20_4_ = auVar55._4_4_ * auVar8._20_4_;
          auVar12._24_4_ = auVar55._8_4_ * auVar8._24_4_;
          auVar12._28_4_ = auVar8._28_4_;
          auVar8 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar28),auVar69);
          auVar13._4_4_ = auVar59._4_4_ * auVar8._4_4_;
          auVar13._0_4_ = auVar59._0_4_ * auVar8._0_4_;
          auVar13._8_4_ = auVar59._8_4_ * auVar8._8_4_;
          auVar13._12_4_ = auVar59._12_4_ * auVar8._12_4_;
          auVar13._16_4_ = auVar59._0_4_ * auVar8._16_4_;
          auVar13._20_4_ = auVar59._4_4_ * auVar8._20_4_;
          auVar13._24_4_ = auVar59._8_4_ * auVar8._24_4_;
          auVar13._28_4_ = auVar8._28_4_;
          auVar8 = vmaxps_avx(auVar12,auVar13);
          auVar34 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar30),auVar106);
          auVar14._4_4_ = auVar68._4_4_ * auVar34._4_4_;
          auVar14._0_4_ = auVar68._0_4_ * auVar34._0_4_;
          auVar14._8_4_ = auVar68._8_4_ * auVar34._8_4_;
          auVar14._12_4_ = auVar68._12_4_ * auVar34._12_4_;
          auVar14._16_4_ = auVar68._0_4_ * auVar34._16_4_;
          auVar14._20_4_ = auVar68._4_4_ * auVar34._20_4_;
          auVar14._24_4_ = auVar68._8_4_ * auVar34._24_4_;
          auVar14._28_4_ = auVar34._28_4_;
          auVar34 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar31 ^ 0x20)),auVar108);
          auVar15._4_4_ = auVar60._4_4_ * auVar34._4_4_;
          auVar15._0_4_ = auVar60._0_4_ * auVar34._0_4_;
          auVar15._8_4_ = auVar60._8_4_ * auVar34._8_4_;
          auVar15._12_4_ = auVar60._12_4_ * auVar34._12_4_;
          auVar15._16_4_ = auVar60._0_4_ * auVar34._16_4_;
          auVar15._20_4_ = auVar60._4_4_ * auVar34._20_4_;
          auVar15._24_4_ = auVar60._8_4_ * auVar34._24_4_;
          auVar15._28_4_ = auVar34._28_4_;
          auVar34 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar28 ^ 0x20)),auVar69);
          auVar16._4_4_ = auVar56._4_4_ * auVar34._4_4_;
          auVar16._0_4_ = auVar56._0_4_ * auVar34._0_4_;
          auVar16._8_4_ = auVar56._8_4_ * auVar34._8_4_;
          auVar16._12_4_ = auVar56._12_4_ * auVar34._12_4_;
          auVar16._16_4_ = auVar56._0_4_ * auVar34._16_4_;
          auVar16._20_4_ = auVar56._4_4_ * auVar34._20_4_;
          auVar16._24_4_ = auVar56._8_4_ * auVar34._24_4_;
          auVar16._28_4_ = auVar34._28_4_;
          auVar7 = vminps_avx(auVar15,auVar16);
          auVar34 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar30 ^ 0x20)),auVar106);
          auVar17._4_4_ = auVar61._4_4_ * auVar34._4_4_;
          auVar17._0_4_ = auVar61._0_4_ * auVar34._0_4_;
          auVar17._8_4_ = auVar61._8_4_ * auVar34._8_4_;
          auVar17._12_4_ = auVar61._12_4_ * auVar34._12_4_;
          auVar17._16_4_ = auVar61._0_4_ * auVar34._16_4_;
          auVar17._20_4_ = auVar61._4_4_ * auVar34._20_4_;
          auVar17._24_4_ = auVar61._8_4_ * auVar34._24_4_;
          auVar17._28_4_ = auVar34._28_4_;
          auVar34 = vmaxps_avx(auVar14,auVar64);
          auVar8 = vmaxps_avx(auVar8,auVar34);
          auVar34 = vminps_avx(auVar17,auVar104);
          auVar34 = vminps_avx(auVar7,auVar34);
          auVar8 = vcmpps_avx(auVar8,auVar34,2);
          auVar52 = vpackssdw_avx(auVar8._0_16_,auVar8._16_16_);
        }
        else {
          if ((int)(uVar25 & 0xf) != 2) {
            cVar23 = (**(code **)((long)This->leafIntersector +
                                 (ulong)*(byte *)(uVar25 & 0xfffffffffffffff0) * 0x40 + 8))
                               (local_1218,ray,context);
            auVar41._8_56_ = extraout_var;
            auVar41._0_8_ = extraout_XMM1_Qa;
            if (cVar23 != '\0') {
              ray->tfar = -INFINITY;
              return;
            }
            goto LAB_00e50a10;
          }
          uVar24 = uVar25 & 0xfffffffffffffff0;
          auVar22 = *(undefined1 (*) [12])(uVar24 + 0x60);
          fVar35 = *(float *)(uVar24 + 0xbc);
          auVar87._0_4_ =
               fVar1 * *(float *)(uVar24 + 0xa0) + fVar2 * *(float *)(uVar24 + 0x100) +
               fVar66 * *(float *)(uVar24 + 0x40);
          auVar87._4_4_ =
               fVar1 * *(float *)(uVar24 + 0xa4) + fVar2 * *(float *)(uVar24 + 0x104) +
               fVar66 * *(float *)(uVar24 + 0x44);
          auVar87._8_4_ =
               fVar1 * *(float *)(uVar24 + 0xa8) + fVar2 * *(float *)(uVar24 + 0x108) +
               fVar66 * *(float *)(uVar24 + 0x48);
          auVar87._12_4_ =
               fVar1 * *(float *)(uVar24 + 0xac) + fVar2 * *(float *)(uVar24 + 0x10c) +
               fVar66 * *(float *)(uVar24 + 0x4c);
          auVar87._16_4_ =
               fVar1 * *(float *)(uVar24 + 0xb0) + fVar2 * *(float *)(uVar24 + 0x110) +
               fVar66 * *(float *)(uVar24 + 0x50);
          auVar87._20_4_ =
               fVar1 * *(float *)(uVar24 + 0xb4) + fVar2 * *(float *)(uVar24 + 0x114) +
               fVar66 * *(float *)(uVar24 + 0x54);
          auVar87._24_4_ =
               fVar1 * *(float *)(uVar24 + 0xb8) + fVar2 * *(float *)(uVar24 + 0x118) +
               fVar66 * *(float *)(uVar24 + 0x58);
          auVar87._28_4_ = auVar68._12_4_ + auVar41._28_4_ + fVar1;
          auVar96._0_4_ =
               fVar2 * *(float *)(uVar24 + 0x120) + fVar1 * *(float *)(uVar24 + 0xc0) +
               fVar66 * *(float *)*(undefined1 (*) [12])(uVar24 + 0x60);
          auVar96._4_4_ =
               fVar2 * *(float *)(uVar24 + 0x124) + fVar1 * *(float *)(uVar24 + 0xc4) +
               fVar66 * *(float *)(uVar24 + 100);
          auVar96._8_4_ =
               fVar2 * *(float *)(uVar24 + 0x128) + fVar1 * *(float *)(uVar24 + 200) +
               fVar66 * *(float *)(uVar24 + 0x68);
          auVar96._12_4_ =
               fVar2 * *(float *)(uVar24 + 300) + fVar1 * *(float *)(uVar24 + 0xcc) +
               fVar66 * *(float *)(uVar24 + 0x6c);
          auVar96._16_4_ =
               fVar2 * *(float *)(uVar24 + 0x130) + fVar1 * *(float *)(uVar24 + 0xd0) +
               fVar66 * *(float *)(uVar24 + 0x70);
          auVar96._20_4_ =
               fVar2 * *(float *)(uVar24 + 0x134) + fVar1 * *(float *)(uVar24 + 0xd4) +
               fVar66 * *(float *)(uVar24 + 0x74);
          auVar96._24_4_ =
               fVar2 * *(float *)(uVar24 + 0x138) + fVar1 * *(float *)(uVar24 + 0xd8) +
               fVar66 * *(float *)(uVar24 + 0x78);
          auVar96._28_4_ = auVar55._12_4_ + auVar60._12_4_ + fVar1;
          auVar77._0_4_ =
               fVar2 * *(float *)(uVar24 + 0x140) + fVar1 * *(float *)(uVar24 + 0xe0) +
               fVar66 * *(float *)(uVar24 + 0x80);
          auVar77._4_4_ =
               fVar2 * *(float *)(uVar24 + 0x144) + fVar1 * *(float *)(uVar24 + 0xe4) +
               fVar66 * *(float *)(uVar24 + 0x84);
          auVar77._8_4_ =
               fVar2 * *(float *)(uVar24 + 0x148) + fVar1 * *(float *)(uVar24 + 0xe8) +
               fVar66 * *(float *)(uVar24 + 0x88);
          auVar77._12_4_ =
               fVar2 * *(float *)(uVar24 + 0x14c) + fVar1 * *(float *)(uVar24 + 0xec) +
               fVar66 * *(float *)(uVar24 + 0x8c);
          auVar77._16_4_ =
               fVar2 * *(float *)(uVar24 + 0x150) + fVar1 * *(float *)(uVar24 + 0xf0) +
               fVar66 * *(float *)(uVar24 + 0x90);
          auVar77._20_4_ =
               fVar2 * *(float *)(uVar24 + 0x154) + fVar1 * *(float *)(uVar24 + 0xf4) +
               fVar66 * *(float *)(uVar24 + 0x94);
          auVar77._24_4_ =
               fVar2 * *(float *)(uVar24 + 0x158) + fVar1 * *(float *)(uVar24 + 0xf8) +
               fVar66 * *(float *)(uVar24 + 0x98);
          auVar77._28_4_ = auVar59._12_4_ + fVar1 + fVar1;
          auVar70._8_4_ = 0x7fffffff;
          auVar70._0_8_ = 0x7fffffff7fffffff;
          auVar70._12_4_ = 0x7fffffff;
          auVar70._16_4_ = 0x7fffffff;
          auVar70._20_4_ = 0x7fffffff;
          auVar70._24_4_ = 0x7fffffff;
          auVar70._28_4_ = 0x7fffffff;
          auVar8 = vandps_avx(auVar87,auVar70);
          auVar105._8_4_ = 0x219392ef;
          auVar105._0_8_ = 0x219392ef219392ef;
          auVar105._12_4_ = 0x219392ef;
          auVar105._16_4_ = 0x219392ef;
          auVar105._20_4_ = 0x219392ef;
          auVar105._24_4_ = 0x219392ef;
          auVar105._28_4_ = 0x219392ef;
          auVar8 = vcmpps_avx(auVar8,auVar105,1);
          auVar34 = vblendvps_avx(auVar87,auVar105,auVar8);
          auVar8 = vandps_avx(auVar96,auVar70);
          auVar8 = vcmpps_avx(auVar8,auVar105,1);
          auVar7 = vblendvps_avx(auVar96,auVar105,auVar8);
          auVar8 = vandps_avx(auVar77,auVar70);
          auVar8 = vcmpps_avx(auVar8,auVar105,1);
          auVar8 = vblendvps_avx(auVar77,auVar105,auVar8);
          auVar40 = vrcpps_avx(auVar34);
          fVar74 = auVar40._0_4_;
          fVar78 = auVar40._4_4_;
          auVar9._4_4_ = fVar78 * auVar34._4_4_;
          auVar9._0_4_ = fVar74 * auVar34._0_4_;
          fVar79 = auVar40._8_4_;
          auVar9._8_4_ = fVar79 * auVar34._8_4_;
          fVar80 = auVar40._12_4_;
          auVar9._12_4_ = fVar80 * auVar34._12_4_;
          fVar81 = auVar40._16_4_;
          auVar9._16_4_ = fVar81 * auVar34._16_4_;
          fVar82 = auVar40._20_4_;
          auVar9._20_4_ = fVar82 * auVar34._20_4_;
          fVar83 = auVar40._24_4_;
          auVar9._24_4_ = fVar83 * auVar34._24_4_;
          auVar9._28_4_ = auVar34._28_4_;
          auVar71._8_4_ = 0x3f800000;
          auVar71._0_8_ = 0x3f8000003f800000;
          auVar71._12_4_ = 0x3f800000;
          auVar71._16_4_ = 0x3f800000;
          auVar71._20_4_ = 0x3f800000;
          auVar71._24_4_ = 0x3f800000;
          auVar71._28_4_ = 0x3f800000;
          auVar9 = vsubps_avx(auVar71,auVar9);
          fVar74 = fVar74 + fVar74 * auVar9._0_4_;
          fVar78 = fVar78 + fVar78 * auVar9._4_4_;
          fVar79 = fVar79 + fVar79 * auVar9._8_4_;
          fVar80 = fVar80 + fVar80 * auVar9._12_4_;
          fVar81 = fVar81 + fVar81 * auVar9._16_4_;
          fVar82 = fVar82 + fVar82 * auVar9._20_4_;
          fVar83 = fVar83 + fVar83 * auVar9._24_4_;
          auVar34 = vrcpps_avx(auVar7);
          fVar84 = auVar34._0_4_;
          fVar88 = auVar34._4_4_;
          auVar10._4_4_ = fVar88 * auVar7._4_4_;
          auVar10._0_4_ = fVar84 * auVar7._0_4_;
          fVar89 = auVar34._8_4_;
          auVar10._8_4_ = fVar89 * auVar7._8_4_;
          fVar90 = auVar34._12_4_;
          auVar10._12_4_ = fVar90 * auVar7._12_4_;
          fVar91 = auVar34._16_4_;
          auVar10._16_4_ = fVar91 * auVar7._16_4_;
          fVar92 = auVar34._20_4_;
          auVar10._20_4_ = fVar92 * auVar7._20_4_;
          fVar93 = auVar34._24_4_;
          auVar10._24_4_ = fVar93 * auVar7._24_4_;
          auVar10._28_4_ = auVar7._28_4_;
          auVar10 = vsubps_avx(auVar71,auVar10);
          fVar84 = fVar84 + fVar84 * auVar10._0_4_;
          fVar88 = fVar88 + fVar88 * auVar10._4_4_;
          fVar89 = fVar89 + fVar89 * auVar10._8_4_;
          fVar90 = fVar90 + fVar90 * auVar10._12_4_;
          fVar91 = fVar91 + fVar91 * auVar10._16_4_;
          fVar92 = fVar92 + fVar92 * auVar10._20_4_;
          fVar93 = fVar93 + fVar93 * auVar10._24_4_;
          auVar7 = vrcpps_avx(auVar8);
          fVar94 = auVar7._0_4_;
          fVar98 = auVar7._4_4_;
          auVar18._4_4_ = fVar98 * auVar8._4_4_;
          auVar18._0_4_ = fVar94 * auVar8._0_4_;
          fVar99 = auVar7._8_4_;
          auVar18._8_4_ = fVar99 * auVar8._8_4_;
          fVar100 = auVar7._12_4_;
          auVar18._12_4_ = fVar100 * auVar8._12_4_;
          fVar101 = auVar7._16_4_;
          auVar18._16_4_ = fVar101 * auVar8._16_4_;
          fVar102 = auVar7._20_4_;
          auVar18._20_4_ = fVar102 * auVar8._20_4_;
          fVar103 = auVar7._24_4_;
          auVar18._24_4_ = fVar103 * auVar8._24_4_;
          auVar18._28_4_ = auVar8._28_4_;
          auVar8 = vsubps_avx(auVar71,auVar18);
          fVar94 = fVar94 + fVar94 * auVar8._0_4_;
          fVar98 = fVar98 + fVar98 * auVar8._4_4_;
          fVar99 = fVar99 + fVar99 * auVar8._8_4_;
          fVar100 = fVar100 + fVar100 * auVar8._12_4_;
          fVar101 = fVar101 + fVar101 * auVar8._16_4_;
          fVar102 = fVar102 + fVar102 * auVar8._20_4_;
          fVar103 = fVar103 + fVar103 * auVar8._24_4_;
          fVar51 = *(float *)(uVar24 + 0x5c) +
                   fVar35 + *(float *)(uVar24 + 0x11c) + *(float *)(uVar24 + 0x17c);
          auVar46._0_4_ =
               -fVar74 * (fVar72 * *(float *)(uVar24 + 0x40) +
                         fVar3 * *(float *)(uVar24 + 0xa0) +
                         fVar4 * *(float *)(uVar24 + 0x100) + *(float *)(uVar24 + 0x160));
          auVar46._4_4_ =
               -fVar78 * (fVar72 * *(float *)(uVar24 + 0x44) +
                         fVar3 * *(float *)(uVar24 + 0xa4) +
                         fVar4 * *(float *)(uVar24 + 0x104) + *(float *)(uVar24 + 0x164));
          auVar46._8_4_ =
               -fVar79 * (fVar72 * *(float *)(uVar24 + 0x48) +
                         fVar3 * *(float *)(uVar24 + 0xa8) +
                         fVar4 * *(float *)(uVar24 + 0x108) + *(float *)(uVar24 + 0x168));
          auVar46._12_4_ =
               -fVar80 * (fVar72 * *(float *)(uVar24 + 0x4c) +
                         fVar3 * *(float *)(uVar24 + 0xac) +
                         fVar4 * *(float *)(uVar24 + 0x10c) + *(float *)(uVar24 + 0x16c));
          fVar48 = -fVar81 * (fVar72 * *(float *)(uVar24 + 0x50) +
                             fVar3 * *(float *)(uVar24 + 0xb0) +
                             fVar4 * *(float *)(uVar24 + 0x110) + *(float *)(uVar24 + 0x170));
          auVar19._16_4_ = fVar48;
          auVar19._0_16_ = auVar46;
          fVar49 = -fVar82 * (fVar72 * *(float *)(uVar24 + 0x54) +
                             fVar3 * *(float *)(uVar24 + 0xb4) +
                             fVar4 * *(float *)(uVar24 + 0x114) + *(float *)(uVar24 + 0x174));
          auVar19._20_4_ = fVar49;
          fVar50 = -fVar83 * (fVar72 * *(float *)(uVar24 + 0x58) +
                             fVar3 * *(float *)(uVar24 + 0xb8) +
                             fVar4 * *(float *)(uVar24 + 0x118) + *(float *)(uVar24 + 0x178));
          auVar19._24_4_ = fVar50;
          auVar19._28_4_ = fVar51;
          local_13f8 = auVar22._0_4_;
          fStack_13f4 = auVar22._4_4_;
          fStack_13f0 = auVar22._8_4_;
          fVar45 = *(float *)(uVar24 + 0xdc) +
                   fVar35 + *(float *)(uVar24 + 0x13c) + *(float *)(uVar24 + 0x19c);
          auVar39._0_4_ =
               -fVar84 * (fVar72 * local_13f8 +
                         fVar3 * *(float *)(uVar24 + 0xc0) +
                         *(float *)(uVar24 + 0x120) * fVar4 + *(float *)(uVar24 + 0x180));
          auVar39._4_4_ =
               -fVar88 * (fVar72 * fStack_13f4 +
                         fVar3 * *(float *)(uVar24 + 0xc4) +
                         *(float *)(uVar24 + 0x124) * fVar4 + *(float *)(uVar24 + 0x184));
          auVar39._8_4_ =
               -fVar89 * (fVar72 * fStack_13f0 +
                         fVar3 * *(float *)(uVar24 + 200) +
                         *(float *)(uVar24 + 0x128) * fVar4 + *(float *)(uVar24 + 0x188));
          auVar39._12_4_ =
               -fVar90 * (fVar72 * *(float *)(uVar24 + 0x6c) +
                         fVar3 * *(float *)(uVar24 + 0xcc) +
                         *(float *)(uVar24 + 300) * fVar4 + *(float *)(uVar24 + 0x18c));
          fVar42 = -fVar91 * (fVar72 * *(float *)(uVar24 + 0x70) +
                             fVar3 * *(float *)(uVar24 + 0xd0) +
                             *(float *)(uVar24 + 0x130) * fVar4 + *(float *)(uVar24 + 400));
          auVar20._16_4_ = fVar42;
          auVar20._0_16_ = auVar39;
          fVar43 = -fVar92 * (fVar72 * *(float *)(uVar24 + 0x74) +
                             fVar3 * *(float *)(uVar24 + 0xd4) +
                             *(float *)(uVar24 + 0x134) * fVar4 + *(float *)(uVar24 + 0x194));
          auVar20._20_4_ = fVar43;
          fVar44 = -fVar93 * (fVar72 * *(float *)(uVar24 + 0x78) +
                             fVar3 * *(float *)(uVar24 + 0xd8) +
                             *(float *)(uVar24 + 0x138) * fVar4 + *(float *)(uVar24 + 0x198));
          auVar20._24_4_ = fVar44;
          auVar20._28_4_ = fVar45;
          fVar38 = *(float *)(uVar24 + 0x9c) +
                   fVar35 + *(float *)(uVar24 + 0x15c) + *(float *)(uVar24 + 0x1bc);
          auVar33._0_4_ =
               -fVar94 * (fVar72 * *(float *)(uVar24 + 0x80) +
                         *(float *)(uVar24 + 0xe0) * fVar3 +
                         *(float *)(uVar24 + 0x140) * fVar4 + *(float *)(uVar24 + 0x1a0));
          auVar33._4_4_ =
               -fVar98 * (fVar72 * *(float *)(uVar24 + 0x84) +
                         *(float *)(uVar24 + 0xe4) * fVar3 +
                         *(float *)(uVar24 + 0x144) * fVar4 + *(float *)(uVar24 + 0x1a4));
          auVar33._8_4_ =
               -fVar99 * (fVar72 * *(float *)(uVar24 + 0x88) +
                         *(float *)(uVar24 + 0xe8) * fVar3 +
                         *(float *)(uVar24 + 0x148) * fVar4 + *(float *)(uVar24 + 0x1a8));
          auVar33._12_4_ =
               -fVar100 *
               (fVar72 * *(float *)(uVar24 + 0x8c) +
               *(float *)(uVar24 + 0xec) * fVar3 +
               *(float *)(uVar24 + 0x14c) * fVar4 + *(float *)(uVar24 + 0x1ac));
          fVar35 = -fVar101 *
                   (fVar72 * *(float *)(uVar24 + 0x90) +
                   *(float *)(uVar24 + 0xf0) * fVar3 +
                   *(float *)(uVar24 + 0x150) * fVar4 + *(float *)(uVar24 + 0x1b0));
          auVar21._16_4_ = fVar35;
          auVar21._0_16_ = auVar33;
          fVar36 = -fVar102 *
                   (fVar72 * *(float *)(uVar24 + 0x94) +
                   *(float *)(uVar24 + 0xf4) * fVar3 +
                   *(float *)(uVar24 + 0x154) * fVar4 + *(float *)(uVar24 + 0x1b4));
          auVar21._20_4_ = fVar36;
          fVar37 = -fVar103 *
                   (fVar72 * *(float *)(uVar24 + 0x98) +
                   *(float *)(uVar24 + 0xf8) * fVar3 +
                   *(float *)(uVar24 + 0x158) * fVar4 + *(float *)(uVar24 + 0x1b8));
          auVar21._24_4_ = fVar37;
          auVar21._28_4_ = fVar38;
          auVar57._0_4_ = fVar74 + auVar46._0_4_;
          auVar57._4_4_ = fVar78 + auVar46._4_4_;
          auVar57._8_4_ = fVar79 + auVar46._8_4_;
          auVar57._12_4_ = fVar80 + auVar46._12_4_;
          auVar58._16_4_ = fVar81 + fVar48;
          auVar58._0_16_ = auVar57;
          auVar58._20_4_ = fVar82 + fVar49;
          auVar58._24_4_ = fVar83 + fVar50;
          auVar58._28_4_ = auVar40._28_4_ + auVar9._28_4_ + fVar51;
          auVar63._0_4_ = fVar84 + auVar39._0_4_;
          auVar63._4_4_ = fVar88 + auVar39._4_4_;
          auVar63._8_4_ = fVar89 + auVar39._8_4_;
          auVar63._12_4_ = fVar90 + auVar39._12_4_;
          auVar65._16_4_ = fVar91 + fVar42;
          auVar65._0_16_ = auVar63;
          auVar65._20_4_ = fVar92 + fVar43;
          auVar65._24_4_ = fVar93 + fVar44;
          auVar65._28_4_ = auVar34._28_4_ + auVar10._28_4_ + fVar45;
          auVar53._0_4_ = fVar94 + auVar33._0_4_;
          auVar53._4_4_ = fVar98 + auVar33._4_4_;
          auVar53._8_4_ = fVar99 + auVar33._8_4_;
          auVar53._12_4_ = fVar100 + auVar33._12_4_;
          auVar54._16_4_ = fVar101 + fVar35;
          auVar54._0_16_ = auVar53;
          auVar54._20_4_ = fVar102 + fVar36;
          auVar54._24_4_ = fVar103 + fVar37;
          auVar54._28_4_ = auVar7._28_4_ + auVar8._28_4_ + fVar38;
          auVar52 = vpminsd_avx(auVar19._16_16_,auVar58._16_16_);
          auVar32 = vpminsd_avx(auVar46,auVar57);
          auVar73._16_16_ = auVar52;
          auVar73._0_16_ = auVar32;
          auVar52 = vpminsd_avx(auVar20._16_16_,auVar65._16_16_);
          auVar32 = vpminsd_avx(auVar39,auVar63);
          auVar97._16_16_ = auVar52;
          auVar97._0_16_ = auVar32;
          auVar52 = vpminsd_avx(auVar21._16_16_,auVar54._16_16_);
          auVar32 = vpminsd_avx(auVar33,auVar53);
          auVar107._16_16_ = auVar52;
          auVar107._0_16_ = auVar32;
          auVar8 = vmaxps_avx(auVar97,auVar107);
          auVar52 = vpmaxsd_avx(auVar19._16_16_,auVar58._16_16_);
          auVar32 = vpmaxsd_avx(auVar46,auVar57);
          auVar47._16_16_ = auVar52;
          auVar47._0_16_ = auVar32;
          auVar52 = vpmaxsd_avx(auVar20._16_16_,auVar65._16_16_);
          auVar32 = vpmaxsd_avx(auVar39,auVar63);
          auVar40._16_16_ = auVar52;
          auVar40._0_16_ = auVar32;
          auVar52 = vpmaxsd_avx(auVar21._16_16_,auVar54._16_16_);
          auVar32 = vpmaxsd_avx(auVar33,auVar53);
          auVar34._16_16_ = auVar52;
          auVar34._0_16_ = auVar32;
          auVar7 = vminps_avx(auVar40,auVar34);
          auVar34 = vmaxps_avx(auVar64,auVar73);
          auVar8 = vmaxps_avx(auVar34,auVar8);
          auVar34 = vminps_avx(auVar104,auVar47);
          auVar34 = vminps_avx(auVar34,auVar7);
          auVar7._4_4_ = auVar8._4_4_ * 0.99999964;
          auVar7._0_4_ = auVar8._0_4_ * 0.99999964;
          auVar7._8_4_ = auVar8._8_4_ * 0.99999964;
          auVar7._12_4_ = auVar8._12_4_ * 0.99999964;
          auVar7._16_4_ = auVar8._16_4_ * 0.99999964;
          auVar7._20_4_ = auVar8._20_4_ * 0.99999964;
          auVar7._24_4_ = auVar8._24_4_ * 0.99999964;
          auVar7._28_4_ = auVar8._28_4_;
          auVar8._4_4_ = auVar34._4_4_ * 1.0000004;
          auVar8._0_4_ = auVar34._0_4_ * 1.0000004;
          auVar8._8_4_ = auVar34._8_4_ * 1.0000004;
          auVar8._12_4_ = auVar34._12_4_ * 1.0000004;
          auVar8._16_4_ = auVar34._16_4_ * 1.0000004;
          auVar8._20_4_ = auVar34._20_4_ * 1.0000004;
          auVar8._24_4_ = auVar34._24_4_ * 1.0000004;
          auVar8._28_4_ = auVar34._28_4_;
          auVar8 = vcmpps_avx(auVar7,auVar8,2);
          auVar52 = vpackssdw_avx(auVar8._0_16_,auVar8._16_16_);
        }
        auVar32 = vpsllw_avx(auVar52,0xf);
        auVar52 = vpacksswb_avx(auVar32,auVar32);
        auVar41 = ZEXT1664(auVar52);
        bVar11 = SUB161(auVar52 >> 7,0) & 1 | (SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar52 >> 0x17,0) & 1) << 2 | (SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar52 >> 0x27,0) & 1) << 4 | (SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar52 >> 0x37,0) & 1) << 6 | SUB161(auVar52 >> 0x3f,0) << 7;
        if ((((((((auVar32 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar32 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar32 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar32 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar32[0xf]
           ) goto LAB_00e50a10;
        uVar24 = uVar25 & 0xfffffffffffffff0;
        lVar6 = 0;
        if (bVar11 != 0) {
          for (; (bVar11 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        uVar25 = *(ulong *)(uVar24 + lVar6 * 8);
        uVar26 = bVar11 - 1 & (uint)bVar11;
        uVar27 = (ulong)uVar26;
        if (uVar26 != 0) {
          do {
            *puVar29 = uVar25;
            puVar29 = puVar29 + 1;
            lVar6 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
              }
            }
            uVar25 = *(ulong *)(uVar24 + lVar6 * 8);
            uVar27 = uVar27 - 1 & uVar27;
          } while (uVar27 != 0);
        }
        goto LAB_00e50a21;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }